

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall tli_window_manager::Text::Text(Text *this,Text *other)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_00109da0;
  Box::Box(&this->super_Box);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_position_00109ca8;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00109ce8;
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  pcVar1 = (other->buffer_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->buffer_,pcVar1,pcVar1 + (other->buffer_)._M_string_length);
  iVar2 = other->frame_height_;
  iVar3 = other->cursor_position_;
  iVar4 = other->index_;
  this->frame_width_ = other->frame_width_;
  this->frame_height_ = iVar2;
  this->cursor_position_ = iVar3;
  this->index_ = iVar4;
  return;
}

Assistant:

Text::Text(const Text &other) : frame_width_{other.frame_width_}, frame_height_{other.frame_height_},
                                cursor_position_{other.cursor_position_}, index_{other.index_},
                                buffer_{other.buffer_} {}